

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::mfhd::print(mfhd *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *this_00;
  mfhd *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================mfhd==================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sequence number is: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,*(uint *)&(this->super_full_box).field_0x6c);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void mfhd::print() const
	{
		std::cout << "=================mfhd==================" << std::endl;
		std::cout << std::setw(33) << std::left << " sequence number is: " << seq_nr_ << std::endl;
	}